

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_function_args_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,TextureFunctionArguments *args,
          bool *p_forward)

{
  string *psVar1;
  uint uVar2;
  int iVar3;
  Dim DVar4;
  Platform PVar5;
  Variant *pVVar6;
  TextureFunctionArguments *pTVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  SPIRVariable *pSVar12;
  MSLConstexprSampler *pMVar13;
  SPIRCombinedImageSampler *pSVar14;
  long *plVar15;
  undefined8 *puVar16;
  SPIRType *pSVar17;
  runtime_error *prVar18;
  size_type *psVar19;
  ulong *puVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  char *pcVar24;
  uint32_t uVar25;
  uint32_t uVar26;
  CompilerMSL *pCVar27;
  _Alloc_hider _Var28;
  undefined8 uVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  uint *in_R9;
  char cVar30;
  undefined4 uVar31;
  undefined8 unaff_R12;
  ulong uVar32;
  uint32_t uVar33;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  string offset_expr;
  string tex_coords;
  string coord_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  TextureFunctionArguments *local_2e8;
  string *local_2e0;
  string local_2d8;
  CompilerMSL *local_2b8;
  undefined1 local_2b0 [32];
  SPIRType *local_290;
  uint local_288;
  uint32_t local_284;
  uint32_t local_280;
  uint32_t local_27c;
  string local_278;
  SPIRType *local_258;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  size_type *local_210;
  undefined4 local_204;
  string local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  bool *local_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar2 = (args->base).img.id;
  uVar32 = (ulong)uVar2;
  local_290 = (args->base).imgtype;
  local_280 = args->lod;
  local_284 = args->grad_x;
  uVar25 = args->grad_y;
  local_27c = args->bias;
  local_2e8 = args;
  local_1d8 = p_forward;
  pSVar12 = Compiler::maybe_get_backing_variable((Compiler *)this,uVar2);
  local_2e0 = __return_storage_ptr__;
  local_2b8 = this;
  if (pSVar12 == (SPIRVariable *)0x0) {
    local_1e0 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1e0;
    local_210 = &__return_storage_ptr__->_M_string_length;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00267bb7:
    bVar8 = true;
    pMVar13 = (MSLConstexprSampler *)0x0;
LAB_00267bbc:
    if (((this->msl_options).swizzle_texture_samples == true) &&
       ((local_2e8->base).is_gather == true)) {
      uVar33 = uVar2;
      if ((uVar32 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr,
         pVVar6[uVar32].type == TypeCombinedImageSampler)) {
        pSVar14 = Variant::get<spirv_cross::SPIRCombinedImageSampler>(pVVar6 + uVar32);
        uVar33 = (pSVar14->image).id;
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_278,&this->super_CompilerGLSL,uVar33,true);
      ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
    }
LAB_00267c52:
    if ((local_2e8->base).is_fetch == false) {
      if (*local_210 != 0) {
        ::std::__cxx11::string::append((char *)local_2e0);
      }
      to_sampler_expression_abi_cxx11_(&local_278,this,uVar2);
      ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
    }
    if ((((bVar8) || (pMVar13->ycbcr_conversion_enable == false)) &&
        ((this->msl_options).swizzle_texture_samples == true)) &&
       ((local_2e8->base).is_gather == true)) {
      to_swizzle_expression_abi_cxx11_((string *)local_2b0,this,uVar2);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
      plVar15 = (long *)::std::__cxx11::string::replace((ulong)local_2b0,0,(char *)0x0,0x2f06f8);
      psVar19 = (size_type *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_278.field_2._M_allocated_capacity = *psVar19;
        local_278.field_2._8_8_ = plVar15[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = *psVar19;
        local_278._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_278._M_string_length = plVar15[1];
      *plVar15 = (long)psVar19;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
        operator_delete((void *)local_2b0._0_8_);
      }
      this->used_swizzle_buffer = true;
    }
    if ((local_2e8->component == 0) || ((this->msl_options).swizzle_texture_samples != true)) {
      uVar31 = 0;
      goto LAB_00267e4c;
    }
    bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_2e8->component);
    to_component_argument_abi_cxx11_((string *)local_2b0,this,local_2e8->component);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
    puVar16 = (undefined8 *)::std::__cxx11::string::replace((ulong)local_2b0,0,(char *)0x0,0x2f06f8)
    ;
    psVar19 = puVar16 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_278.field_2._M_allocated_capacity = *psVar19;
      local_278.field_2._8_8_ = puVar16[3];
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    }
    else {
      local_278.field_2._M_allocated_capacity = *psVar19;
      local_278._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_278._M_string_length = puVar16[1];
    *puVar16 = psVar19;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_278._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_);
    }
    uVar31 = 0;
    bVar9 = false;
    if (bVar8) goto LAB_00267e4c;
  }
  else {
    uVar33 = (pSVar12->basevariable).id;
    if (uVar33 == 0) {
      uVar33 = (pSVar12->super_IVariant).self.id;
    }
    pMVar13 = find_constexpr_sampler(this,uVar33);
    bVar8 = Compiler::has_extended_decoration
                      ((Compiler *)this,(pSVar12->super_IVariant).self.id,
                       SPIRVCrossDecorationDynamicImageSampler);
    local_1e0 = &local_2e0->field_2;
    (local_2e0->_M_dataplus)._M_p = (pointer)local_1e0;
    local_210 = &local_2e0->_M_string_length;
    local_2e0->_M_string_length = 0;
    (local_2e0->field_2)._M_local_buf[0] = '\0';
    uVar31 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
    if (!bVar8) {
      if (pMVar13 == (MSLConstexprSampler *)0x0) goto LAB_00267bb7;
      if (pMVar13->ycbcr_conversion_enable != true) {
        bVar8 = false;
        goto LAB_00267bbc;
      }
      if (pMVar13->planes < 2) {
        bVar8 = false;
      }
      else {
        CompilerGLSL::to_expression_abi_cxx11_(&local_278,&this->super_CompilerGLSL,uVar2,true);
        ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_278._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p);
        }
        local_328._M_dataplus._M_p._0_4_ = 1;
        if (1 < pMVar13->planes) {
          psVar1 = &local_2b8->plane_name_suffix;
          do {
            CompilerGLSL::to_expression_abi_cxx11_
                      ((string *)local_2b0,&local_2b8->super_CompilerGLSL,uVar2,true);
            in_R8 = &local_328;
            join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                      (&local_278,(spirv_cross *)0x2f06f8,(char (*) [3])local_2b0,psVar1,&local_328,
                       in_R9);
            ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_278._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p);
            }
            if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
              operator_delete((void *)local_2b0._0_8_);
            }
            uVar11 = (uint)local_328._M_dataplus._M_p + 1;
            local_328._M_dataplus._M_p._0_4_ = uVar11;
          } while (uVar11 < pMVar13->planes);
        }
        bVar8 = false;
        this = local_2b8;
      }
      goto LAB_00267c52;
    }
LAB_00267e4c:
    bVar9 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_2e8->coord);
  }
  pTVar7 = local_2e8;
  CompilerGLSL::to_enclosed_expression_abi_cxx11_
            (&local_278,&this->super_CompilerGLSL,local_2e8->coord,true);
  local_258 = Compiler::expression_type((Compiler *)this,pTVar7->coord);
  iVar3 = *(int *)&(local_258->super_IVariant).field_0xc;
  local_2b0._0_8_ = local_2b0 + 0x10;
  local_204 = uVar31;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_2b0,local_278._M_dataplus._M_p,
             local_278._M_dataplus._M_p + local_278._M_string_length);
  pSVar17 = local_258;
  uVar11 = iVar3 - 0xc;
  uVar33 = 0;
  cVar30 = '\0';
  local_288 = uVar11;
  switch((local_290->image).dim) {
  case Dim1D:
    if (1 < local_258->vecsize) {
      CompilerGLSL::enclose_expression(&local_308,&this->super_CompilerGLSL,(string *)local_2b0);
      plVar15 = (long *)::std::__cxx11::string::append((char *)&local_308);
      puVar20 = (ulong *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = plVar15[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_328._M_string_length = plVar15[1];
      *plVar15 = (long)puVar20;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
    }
    if ((local_2e8->base).is_fetch == true) {
      pCVar27 = (CompilerMSL *)local_2b0._0_8_;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_2b0._0_8_,(char *)(local_2b0._8_8_ + local_2b0._0_8_));
      round_fp_tex_coords(&local_2d8,pCVar27,&local_d0,local_288 < 3);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f101e);
      paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 == paVar34) {
        local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
        local_308.field_2._8_8_ = puVar16[3];
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      }
      else {
        local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
        local_308._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_308._M_string_length = puVar16[1];
      *puVar16 = paVar34;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      this = local_2b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
        this = local_2b8;
      }
    }
    else if ((*(uint *)&(pSVar17->super_IVariant).field_0xc & 0xfffffffd) == 0xc) {
      convert_to_f32(&local_328,this,(string *)local_2b0,1);
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
    }
    uVar33 = 1;
    if ((this->msl_options).texture_1D_as_2D == true) {
      if ((local_2e8->base).is_fetch == true) {
        ::std::operator+(&local_308,"uint2(",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b0);
        puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      }
      else {
        ::std::operator+(&local_308,"float2(",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b0);
        puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      }
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      _Var28._M_p = local_308._M_dataplus._M_p;
      this = local_2b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
LAB_00268e07:
        uVar33 = 1;
        operator_delete(_Var28._M_p);
      }
    }
    goto LAB_00268e0c;
  case Dim2D:
    if (2 < local_258->vecsize) {
      CompilerGLSL::enclose_expression(&local_308,&this->super_CompilerGLSL,(string *)local_2b0);
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
    }
    if ((local_2e8->base).is_fetch == true) {
      pCVar27 = (CompilerMSL *)local_2b0._0_8_;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,local_2b0._0_8_,(char *)(local_2b0._8_8_ + local_2b0._0_8_));
      round_fp_tex_coords(&local_2d8,pCVar27,&local_150,local_288 < 3);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f0fd5);
      paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 == paVar34) {
        local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
        local_308.field_2._8_8_ = puVar16[3];
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      }
      else {
        local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
        local_308._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_308._M_string_length = puVar16[1];
      *puVar16 = paVar34;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      uVar33 = 2;
LAB_00268da0:
      cVar30 = '\0';
      this = local_2b8;
    }
    else {
      if ((*(uint *)&(pSVar17->super_IVariant).field_0xc & 0xfffffffd) != 0xc) {
        uVar33 = 2;
        goto LAB_00268e0c;
      }
      convert_to_f32(&local_328,this,(string *)local_2b0,2);
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      uVar33 = 2;
LAB_00268676:
      cVar30 = '\0';
    }
    break;
  case Dim3D:
    if (3 < local_258->vecsize) {
      CompilerGLSL::enclose_expression(&local_308,&this->super_CompilerGLSL,(string *)local_2b0);
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
    }
    if ((local_2e8->base).is_fetch == true) {
      pCVar27 = (CompilerMSL *)local_2b0._0_8_;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_2b0._0_8_,(char *)(local_2b0._8_8_ + local_2b0._0_8_));
      round_fp_tex_coords(&local_2d8,pCVar27,&local_170,local_288 < 3);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f3fb2);
      paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 == paVar34) {
        local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
        local_308.field_2._8_8_ = puVar16[3];
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      }
      else {
        local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
        local_308._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_308._M_string_length = puVar16[1];
      *puVar16 = paVar34;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      uVar33 = 3;
      goto LAB_00268da0;
    }
    if ((*(uint *)&(pSVar17->super_IVariant).field_0xc & 0xfffffffd) == 0xc) {
      convert_to_f32(&local_328,this,(string *)local_2b0,3);
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      uVar33 = 3;
      goto LAB_00268676;
    }
    uVar33 = 3;
    goto LAB_00268e0c;
  case DimCube:
    cVar30 = (local_2e8->base).is_fetch;
    if ((bool)cVar30 == true) {
      ::std::__cxx11::string::append(local_2b0);
      pCVar27 = (CompilerMSL *)local_2b0._0_8_;
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_2b0._0_8_,(char *)(local_2b0._8_8_ + local_2b0._0_8_));
      round_fp_tex_coords(&local_2d8,pCVar27,&local_190,local_288 < 3);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f0fd5);
      paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 == paVar34) {
        local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
        local_308.field_2._8_8_ = puVar16[3];
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      }
      else {
        local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
        local_308._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_308._M_string_length = puVar16[1];
      *puVar16 = paVar34;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      this = local_2b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      _Var28._M_p = local_190._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
LAB_00268caf:
        operator_delete(_Var28._M_p);
      }
    }
    else if (3 < local_258->vecsize) {
      CompilerGLSL::enclose_expression(&local_308,&this->super_CompilerGLSL,(string *)local_2b0);
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      _Var28._M_p = local_308._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) goto LAB_00268caf;
    }
    if ((*(uint *)&(local_258->super_IVariant).field_0xc & 0xfffffffd) == 0xc) {
      convert_to_f32(&local_328,this,(string *)local_2b0,3);
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      uVar33 = 3;
    }
    else {
      uVar33 = 3;
    }
    break;
  case DimBuffer:
    if (1 < local_258->vecsize) {
      CompilerGLSL::enclose_expression(&local_308,&this->super_CompilerGLSL,(string *)local_2b0);
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
    }
    if ((this->msl_options).texture_buffer_native == true) {
      paVar34 = &local_f0.field_2;
      pCVar27 = (CompilerMSL *)local_2b0._0_8_;
      local_f0._M_dataplus._M_p = (pointer)paVar34;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_2b0._0_8_,(char *)(local_2b0._8_8_ + local_2b0._0_8_));
      round_fp_tex_coords(&local_2d8,pCVar27,&local_f0,uVar11 < 3);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f101e);
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 == paVar21) {
        local_308.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_308.field_2._8_8_ = puVar16[3];
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      }
      else {
        local_308.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_308._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_308._M_string_length = puVar16[1];
      *puVar16 = paVar21;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      _Var28._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
        _Var28._M_p = local_f0._M_dataplus._M_p;
      }
LAB_00268d90:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var28._M_p != paVar34) {
        operator_delete(_Var28._M_p);
      }
      uVar33 = 1;
      goto LAB_00268da0;
    }
    uVar33 = 1;
    if ((local_2e8->base).is_fetch == true) {
      if ((this->msl_options).texel_buffer_texture_width == 0) {
        paVar34 = &local_130.field_2;
        pCVar27 = (CompilerMSL *)local_2b0._0_8_;
        local_130._M_dataplus._M_p = (pointer)paVar34;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_2b0._0_8_,(char *)(local_2b0._8_8_ + local_2b0._0_8_))
        ;
        round_fp_tex_coords(&local_250,pCVar27,&local_130,uVar11 < 3);
        ::std::operator+(&local_230,"spvTexelBufferCoord(",&local_250);
        puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_230);
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar21) {
          local_2d8.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_2d8.field_2._8_8_ = puVar16[3];
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        }
        else {
          local_2d8.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_2d8._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_2d8._M_string_length = puVar16[1];
        *puVar16 = paVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        CompilerGLSL::to_expression_abi_cxx11_(&local_200,&local_2b8->super_CompilerGLSL,uVar2,true)
        ;
        ::std::operator+(&local_308,&local_2d8,&local_200);
        puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
        puVar20 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar20) {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328.field_2._8_8_ = puVar16[3];
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_328._M_string_length = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
        _Var28._M_p = local_130._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
          _Var28._M_p = local_130._M_dataplus._M_p;
        }
        goto LAB_00268d90;
      }
      pCVar27 = (CompilerMSL *)local_2b0._0_8_;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_2b0._0_8_,(char *)(local_2b0._8_8_ + local_2b0._0_8_));
      round_fp_tex_coords(&local_2d8,pCVar27,&local_110,uVar11 < 3);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f0feb);
      paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 == paVar34) {
        local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
        local_308.field_2._8_8_ = puVar16[3];
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      }
      else {
        local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
        local_308._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_308._M_string_length = puVar16[1];
      *puVar16 = paVar34;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      this = local_2b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      _Var28._M_p = local_110._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) goto LAB_00268e07;
    }
LAB_00268e0c:
    cVar30 = '\0';
    break;
  case DimSubpassData:
    cVar30 = '\0';
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x16;
    ::std::__cxx11::string::_M_replace((ulong)local_2b0,0,(char *)local_2b0._8_8_,0x2f1000);
    uVar33 = 2;
  }
  if ((local_2e8->base).is_fetch == true) {
    uVar26 = local_2e8->offset;
    if (uVar26 == 0) {
      uVar26 = local_2e8->coffset;
      if (uVar26 == 0) goto LAB_00269118;
      if (bVar9 == false) {
        bVar9 = false;
      }
      else {
        bVar9 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,uVar26);
        uVar26 = local_2e8->coffset;
      }
      pSVar17 = Compiler::expression_type((Compiler *)this,uVar26);
      if (*(int *)&(pSVar17->super_IVariant).field_0xc == 8) {
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  (&local_308,&this->super_CompilerGLSL,local_2e8->coffset,true);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
        puVar16 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,0x2f3a35);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        puVar20 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar20) {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328.field_2._8_8_ = puVar16[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_328._M_string_length = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ::std::__cxx11::string::_M_append(local_2b0,(ulong)local_328._M_dataplus._M_p);
      }
      else {
        CompilerGLSL::bitcast_expression_abi_cxx11_
                  (&local_308,&this->super_CompilerGLSL,UInt,local_2e8->coffset);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
        puVar16 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,0x2f3a35);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        puVar20 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar20) {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328.field_2._8_8_ = puVar16[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_328._M_string_length = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ::std::__cxx11::string::_M_append(local_2b0,(ulong)local_328._M_dataplus._M_p);
      }
    }
    else {
      if (bVar9 == false) {
        bVar9 = false;
      }
      else {
        bVar9 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,uVar26);
        uVar26 = local_2e8->offset;
      }
      pSVar17 = Compiler::expression_type((Compiler *)this,uVar26);
      if (*(int *)&(pSVar17->super_IVariant).field_0xc == 8) {
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  (&local_308,&this->super_CompilerGLSL,local_2e8->offset,true);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
        puVar16 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,0x2f3a35);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        puVar20 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar20) {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328.field_2._8_8_ = puVar16[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_328._M_string_length = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ::std::__cxx11::string::_M_append(local_2b0,(ulong)local_328._M_dataplus._M_p);
      }
      else {
        CompilerGLSL::bitcast_expression_abi_cxx11_
                  (&local_308,&this->super_CompilerGLSL,UInt,local_2e8->offset);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
        puVar16 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,0x2f3a35);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        puVar20 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar20) {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328.field_2._8_8_ = puVar16[3];
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_328._M_string_length = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ::std::__cxx11::string::_M_append(local_2b0,(ulong)local_328._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
  }
LAB_00269118:
  if ((local_2e8->base).is_proj == true) {
    if ((*(uint *)&(local_258->super_IVariant).field_0xc & 0xfffffffd) == 0xc) {
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                (&local_2d8,&this->super_CompilerGLSL,local_2e8->coord,uVar33);
      convert_to_f32(&local_308,this,&local_2d8,1);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,0x2e4b8f);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::_M_append(local_2b0,(ulong)local_328._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      _Var28._M_p = local_2d8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
LAB_00269262:
        operator_delete(_Var28._M_p);
      }
    }
    else {
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                (&local_308,&this->super_CompilerGLSL,local_2e8->coord,uVar33);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,0x2e4b8f);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::_M_append(local_2b0,(ulong)local_328._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      _Var28._M_p = local_308._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) goto LAB_00269262;
    }
  }
  if (*local_210 != 0) {
    ::std::__cxx11::string::append((char *)local_2e0);
  }
  if ((((local_290->image).dim == DimCube) && ((local_290->image).arrayed == true)) &&
     ((this->msl_options).emulate_cube_array == true)) {
    ::std::operator+(&local_308,"spvCubemapTo2DArrayFace(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0)
    ;
    plVar15 = (long *)::std::__cxx11::string::append((char *)&local_308);
    paVar34 = &local_328.field_2;
    psVar19 = (size_type *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_328.field_2._M_allocated_capacity = *psVar19;
      local_328.field_2._8_8_ = plVar15[3];
      local_328._M_dataplus._M_p = (pointer)paVar34;
    }
    else {
      local_328.field_2._M_allocated_capacity = *psVar19;
      local_328._M_dataplus._M_p = (pointer)*plVar15;
    }
    local_328._M_string_length = plVar15[1];
    *plVar15 = (long)psVar19;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_328._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != paVar34) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    paVar21 = &local_308.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != paVar21) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if (cVar30 == '\0') {
      ::std::operator+(&local_230,", uint(spvCubemapTo2DArrayFace(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b0);
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_230);
      paVar22 = &local_2d8.field_2;
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 == paVar23) {
        local_2d8.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
        local_2d8.field_2._8_8_ = puVar16[3];
        local_2d8._M_dataplus._M_p = (pointer)paVar22;
      }
      else {
        local_2d8.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
        local_2d8._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_2d8._M_string_length = puVar16[1];
      *puVar16 = paVar23;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      pCVar27 = local_2b8;
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                (&local_50,&local_2b8->super_CompilerGLSL,local_2e8->coord,uVar33);
      round_fp_tex_coords(&local_250,pCVar27,&local_50,local_288 < 3);
      uVar32 = (long)&((_Alloc_hider *)local_2d8._M_string_length)->_M_p +
               local_250._M_string_length;
      uVar29 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != paVar22) {
        uVar29 = local_2d8.field_2._M_allocated_capacity;
      }
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_2d8._M_string_length;
      if ((ulong)uVar29 < uVar32) {
        uVar29 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          uVar29 = local_250.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar29 < uVar32) goto LAB_00269bb6;
        puVar16 = (undefined8 *)
                  ::std::__cxx11::string::replace
                            ((ulong)&local_250,0,(char *)0x0,(ulong)local_2d8._M_dataplus._M_p);
      }
      else {
LAB_00269bb6:
        puVar16 = (undefined8 *)
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_2d8,(ulong)local_250._M_dataplus._M_p);
      }
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 == paVar23) {
        local_308.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
        local_308.field_2._8_8_ = puVar16[3];
        local_308._M_dataplus._M_p = (pointer)paVar21;
      }
      else {
        local_308.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
        local_308._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_308._M_string_length = puVar16[1];
      *puVar16 = paVar23;
      puVar16[1] = 0;
      paVar23->_M_local_buf[0] = '\0';
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)paVar34;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_328._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != paVar34) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      this = local_2b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != paVar21) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != paVar22) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      _Var28._M_p = local_230._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) goto LAB_00269c30;
    }
    else {
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                (&local_2d8,&local_2b8->super_CompilerGLSL,local_2e8->coord,2);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f101c);
      paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 == paVar22) {
        local_308.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
        local_308.field_2._8_8_ = puVar16[3];
        local_308._M_dataplus._M_p = (pointer)paVar21;
      }
      else {
        local_308.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
        local_308._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_308._M_string_length = puVar16[1];
      *puVar16 = paVar22;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)paVar34;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_328._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != paVar34) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      this = local_2b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != paVar21) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      _Var28._M_p = local_2d8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
LAB_00269c30:
        operator_delete(_Var28._M_p);
      }
    }
    add_spv_func_and_recompile(this,SPVFuncImplCubemapTo2DArrayFace);
  }
  else {
    ::std::__cxx11::string::_M_append((char *)local_2e0,local_2b0._0_8_);
    uVar2 = local_288;
    if (cVar30 != '\0') {
      if ((local_290->image).arrayed == true) {
        CompilerGLSL::to_extract_component_expression_abi_cxx11_
                  (&local_2d8,&this->super_CompilerGLSL,local_2e8->coord,2);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7;
        puVar16 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f101c);
        paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar34) {
          local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
          local_308.field_2._8_8_ = puVar16[3];
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        }
        else {
          local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
          local_308._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_308._M_string_length = puVar16[1];
        *puVar16 = paVar34;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
        puVar20 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar20) {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328.field_2._8_8_ = puVar16[3];
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_328._M_string_length = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_328._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        this = local_2b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        local_70._M_dataplus._M_p = local_2d8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
LAB_002695b8:
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      else {
        CompilerGLSL::to_extract_component_expression_abi_cxx11_
                  (&local_70,&this->super_CompilerGLSL,local_2e8->coord,2);
        round_fp_tex_coords(&local_2d8,this,&local_70,uVar2 < 3);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7;
        puVar16 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f101c);
        paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar34) {
          local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
          local_308.field_2._8_8_ = puVar16[3];
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        }
        else {
          local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
          local_308._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_308._M_string_length = puVar16[1];
        *puVar16 = paVar34;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
        puVar20 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar20) {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328.field_2._8_8_ = puVar16[3];
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_328._M_string_length = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_328._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        this = local_2b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_002695b8;
      }
    }
    DVar4 = (local_290->image).dim;
    if ((local_290->image).arrayed == true) {
      if ((DVar4 == DimCube) && ((local_2e8->base).is_fetch == true)) {
        CompilerGLSL::to_extract_component_expression_abi_cxx11_
                  (&local_2d8,&this->super_CompilerGLSL,local_2e8->coord,2);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7;
        puVar16 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f101c);
        paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar34) {
          local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
          local_308.field_2._8_8_ = puVar16[3];
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        }
        else {
          local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
          local_308._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_308._M_string_length = puVar16[1];
        *puVar16 = paVar34;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
        puVar20 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar20) {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328.field_2._8_8_ = puVar16[3];
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_328._M_string_length = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_328._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        this = local_2b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
      }
      else {
        CompilerGLSL::to_extract_component_expression_abi_cxx11_
                  (&local_90,&this->super_CompilerGLSL,local_2e8->coord,uVar33);
        round_fp_tex_coords(&local_2d8,this,&local_90,uVar2 < 3);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7;
        puVar16 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f101c);
        paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar34) {
          local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
          local_308.field_2._8_8_ = puVar16[3];
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        }
        else {
          local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
          local_308._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_308._M_string_length = puVar16[1];
        *puVar16 = paVar34;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
        puVar20 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar20) {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328.field_2._8_8_ = puVar16[3];
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        }
        else {
          local_328.field_2._M_allocated_capacity = *puVar20;
          local_328._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_328._M_string_length = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_328._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        this = local_2b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if (((local_290->image).dim == DimSubpassData) &&
           (((this->msl_options).multiview != false ||
            ((this->msl_options).arrayed_subpass_input != false)))) goto LAB_002698ad;
      }
    }
    else if ((DVar4 == DimSubpassData) &&
            (((this->msl_options).multiview != false ||
             ((this->msl_options).arrayed_subpass_input == true)))) {
LAB_002698ad:
      ::std::__cxx11::string::append((char *)local_2e0);
    }
  }
  if (local_2e8->dref != 0) {
    if (bVar9 == false) {
      bVar9 = false;
    }
    else {
      bVar9 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_2e8->dref);
    }
    ::std::__cxx11::string::append((char *)local_2e0);
    pTVar7 = local_2e8;
    pSVar17 = Compiler::expression_type((Compiler *)this,local_2e8->dref);
    paVar34 = &local_328.field_2;
    local_328._M_string_length = 0;
    local_328.field_2._M_allocated_capacity =
         local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_328._M_dataplus._M_p = (pointer)paVar34;
    if ((pTVar7->base).is_proj == true) {
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_2d8,&this->super_CompilerGLSL,pTVar7->dref,true);
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                (&local_230,&this->super_CompilerGLSL,pTVar7->coord,uVar33);
      join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string>
                (&local_308,(spirv_cross *)&local_2d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e4b8f,
                 (char (*) [4])&local_230,in_R8);
      ::std::__cxx11::string::operator=((string *)&local_328,(string *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
    }
    else {
      CompilerGLSL::to_expression_abi_cxx11_(&local_308,&this->super_CompilerGLSL,pTVar7->dref,true)
      ;
      ::std::__cxx11::string::operator=((string *)&local_328,(string *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
    }
    if ((*(uint *)&(pSVar17->super_IVariant).field_0xc & 0xfffffffd) == 0xc) {
      convert_to_f32(&local_308,this,&local_328,1);
      ::std::__cxx11::string::operator=((string *)&local_328,(string *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
    }
    ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_328._M_dataplus._M_p);
    if ((this->msl_options).platform == macOS) {
      bVar8 = true;
      if (local_284 != 0 || uVar25 != 0) {
        bVar10 = true;
        bVar8 = true;
        if (local_284 != 0) {
          bVar8 = CompilerGLSL::expression_is_constant_null(&this->super_CompilerGLSL,local_284);
        }
        if (uVar25 != 0) {
          bVar10 = CompilerGLSL::expression_is_constant_null(&this->super_CompilerGLSL,uVar25);
        }
        if ((bVar8 & bVar10) != 1) {
          prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_308,
                     "Using non-constant 0.0 gradient() qualifier for sample_compare. This is not supported in MSL macOS."
                     ,"");
          ::std::runtime_error::runtime_error(prVar18,(string *)&local_308);
          *(undefined ***)prVar18 = &PTR__runtime_error_00357118;
          __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::append((char *)local_2e0);
        bVar8 = (this->msl_options).platform == macOS;
        local_280 = 0;
      }
      if ((bool)(local_27c != 0 & bVar8)) {
        bVar8 = CompilerGLSL::expression_is_constant_null(&this->super_CompilerGLSL,local_27c);
        if (!bVar8) {
          prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_308,
                     "Using non-constant 0.0 bias() qualifier for sample_compare. This is not supported in MSL macOS."
                     ,"");
          ::std::runtime_error::runtime_error(prVar18,(string *)&local_308);
          *(undefined ***)prVar18 = &PTR__runtime_error_00357118;
          __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_284 = 0;
        uVar25 = 0;
        local_27c = 0;
      }
      else {
        local_284 = 0;
        uVar25 = 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != paVar34) {
      operator_delete(local_328._M_dataplus._M_p);
    }
  }
  if ((local_27c != 0) &&
     (((local_290->image).dim != Dim1D || ((this->msl_options).texture_1D_as_2D == true)))) {
    if (bVar9 == false) {
      bVar9 = false;
    }
    else {
      bVar9 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_27c);
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_2d8,&this->super_CompilerGLSL,local_27c,true);
    puVar16 = (undefined8 *)
              ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f116d);
    paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 == paVar34) {
      local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
      local_308.field_2._8_8_ = puVar16[3];
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    }
    else {
      local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
      local_308._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_308._M_string_length = puVar16[1];
    *puVar16 = paVar34;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
    puVar20 = puVar16 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar20) {
      local_328.field_2._M_allocated_capacity = *puVar20;
      local_328.field_2._8_8_ = puVar16[3];
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    }
    else {
      local_328.field_2._M_allocated_capacity = *puVar20;
      local_328._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_328._M_string_length = puVar16[1];
    *puVar16 = puVar20;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_328._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
  }
  if (local_280 == 0) {
    if ((((local_2e8->base).is_fetch == true) &&
        (DVar4 = (local_290->image).dim, DVar4 != DimBuffer)) &&
       (((DVar4 != Dim1D || ((this->msl_options).texture_1D_as_2D == true)) &&
        (((local_290->image).ms == false && ((local_290->image).sampled != 2)))))) {
      ::std::__cxx11::string::append((char *)local_2e0);
    }
  }
  else if (((local_290->image).dim != Dim1D) || ((this->msl_options).texture_1D_as_2D == true)) {
    if (bVar9 == false) {
      bVar9 = false;
    }
    else {
      bVar9 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_280);
    }
    if ((local_2e8->base).is_fetch == true) {
      CompilerGLSL::to_expression_abi_cxx11_(&local_308,&this->super_CompilerGLSL,local_280,true);
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,0x2f06f8);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_328._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      psVar1 = &local_308;
    }
    else {
      CompilerGLSL::to_expression_abi_cxx11_(&local_2d8,&this->super_CompilerGLSL,local_280,true);
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f1175);
      paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 == paVar34) {
        local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
        local_308.field_2._8_8_ = puVar16[3];
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      }
      else {
        local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
        local_308._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_308._M_string_length = puVar16[1];
      *puVar16 = paVar34;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_308);
      puVar20 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar20) {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328.field_2._8_8_ = puVar16[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar20;
        local_328._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_328._M_string_length = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_328._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      psVar1 = &local_2d8;
    }
    paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&(psVar1->field_2)._M_allocated_capacity)[-2];
    if (paVar34 != &psVar1->field_2) {
      operator_delete(paVar34);
    }
  }
  if ((local_284 != 0 || uVar25 != 0) &&
     (((local_290->image).dim != Dim1D || ((this->msl_options).texture_1D_as_2D == true)))) {
    if ((bVar9 == false) ||
       (bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_284), !bVar8)) {
      bVar9 = false;
    }
    else {
      bVar9 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,uVar25);
    }
    local_328._M_string_length = 0;
    local_328.field_2._M_allocated_capacity =
         local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
    DVar4 = (local_290->image).dim;
    if (DVar4 == DimCube) {
      if (((local_290->image).arrayed == true) && ((this->msl_options).emulate_cube_array != false))
      {
LAB_0026a31e:
        pcVar24 = "2d";
      }
      else {
        pcVar24 = "cube";
      }
    }
    else if (DVar4 == Dim3D) {
      pcVar24 = "3d";
    }
    else {
      if (DVar4 == Dim2D) goto LAB_0026a31e;
      pcVar24 = "unsupported_gradient_dimension";
    }
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    ::std::__cxx11::string::_M_replace((ulong)&local_328,0,(char *)0x0,(ulong)pcVar24);
    ::std::operator+(&local_b0,", gradient",&local_328);
    plVar15 = (long *)::std::__cxx11::string::append((char *)&local_b0);
    paVar34 = &local_200.field_2;
    puVar20 = (ulong *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar20) {
      local_200.field_2._M_allocated_capacity = *puVar20;
      local_200.field_2._8_8_ = plVar15[3];
      local_200._M_dataplus._M_p = (pointer)paVar34;
    }
    else {
      local_200.field_2._M_allocated_capacity = *puVar20;
      local_200._M_dataplus._M_p = (pointer)*plVar15;
    }
    local_200._M_string_length = plVar15[1];
    *plVar15 = (long)puVar20;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    CompilerGLSL::to_expression_abi_cxx11_(&local_1b0,&this->super_CompilerGLSL,local_284,true);
    uVar29 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar34) {
      uVar29 = local_200.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar29 < local_1b0._M_string_length + local_200._M_string_length) {
      uVar29 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        uVar29 = local_1b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar29 < local_1b0._M_string_length + local_200._M_string_length)
      goto LAB_0026a472;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&local_1b0,0,(char *)0x0,(ulong)local_200._M_dataplus._M_p);
    }
    else {
LAB_0026a472:
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::_M_append
                          ((char *)&local_200,(ulong)local_1b0._M_dataplus._M_p);
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    puVar20 = puVar16 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar20) {
      local_250.field_2._M_allocated_capacity = *puVar20;
      local_250.field_2._8_8_ = puVar16[3];
    }
    else {
      local_250.field_2._M_allocated_capacity = *puVar20;
      local_250._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_250._M_string_length = puVar16[1];
    *puVar16 = puVar20;
    puVar16[1] = 0;
    *(undefined1 *)puVar20 = 0;
    puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_250);
    paVar21 = &local_230.field_2;
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 == paVar22) {
      local_230.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_230.field_2._8_8_ = puVar16[3];
      local_230._M_dataplus._M_p = (pointer)paVar21;
    }
    else {
      local_230.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_230._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_230._M_string_length = puVar16[1];
    *puVar16 = paVar22;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    CompilerGLSL::to_expression_abi_cxx11_(&local_1d0,&local_2b8->super_CompilerGLSL,uVar25,true);
    uVar29 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar21) {
      uVar29 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar29 < local_1d0._M_string_length + local_230._M_string_length) {
      uVar29 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        uVar29 = local_1d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar29 < local_1d0._M_string_length + local_230._M_string_length)
      goto LAB_0026a5c2;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&local_1d0,0,(char *)0x0,(ulong)local_230._M_dataplus._M_p);
    }
    else {
LAB_0026a5c2:
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::_M_append
                          ((char *)&local_230,(ulong)local_1d0._M_dataplus._M_p);
    }
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 == paVar22) {
      local_2d8.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_2d8.field_2._8_8_ = puVar16[3];
    }
    else {
      local_2d8.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_2d8._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_2d8._M_string_length = puVar16[1];
    *puVar16 = paVar22;
    puVar16[1] = 0;
    paVar22->_M_local_buf[0] = '\0';
    puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_2d8);
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 == paVar22) {
      local_308.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_308.field_2._8_8_ = puVar16[3];
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    }
    else {
      local_308.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_308._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_308._M_string_length = puVar16[1];
    *puVar16 = paVar22;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar21) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    this = local_2b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar34) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
  }
  uVar25 = local_2e8->min_lod;
  if (uVar25 != 0) {
    PVar5 = (this->msl_options).platform;
    if (PVar5 == macOS) {
      if ((this->msl_options).msl_version < 0x4ee8) {
        prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_328,
                   "min_lod_clamp() is only supported in MSL 2.2+ and up on macOS.","");
        ::std::runtime_error::runtime_error(prVar18,(string *)&local_328);
        *(undefined ***)prVar18 = &PTR__runtime_error_00357118;
        __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else if (PVar5 == iOS) {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_328,"min_lod_clamp() is not supported on iOS.","");
      ::std::runtime_error::runtime_error(prVar18,(string *)&local_328);
      *(undefined ***)prVar18 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (bVar9 == false) {
      bVar9 = false;
    }
    else {
      bVar9 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,uVar25);
      uVar25 = local_2e8->min_lod;
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_2d8,&this->super_CompilerGLSL,uVar25,true);
    puVar16 = (undefined8 *)
              ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f1210);
    paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 == paVar34) {
      local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
      local_308.field_2._8_8_ = puVar16[3];
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    }
    else {
      local_308.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
      local_308._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_308._M_string_length = puVar16[1];
    *puVar16 = paVar34;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    plVar15 = (long *)::std::__cxx11::string::append((char *)&local_308);
    puVar20 = (ulong *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar20) {
      local_328.field_2._M_allocated_capacity = *puVar20;
      local_328.field_2._8_8_ = plVar15[3];
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    }
    else {
      local_328.field_2._M_allocated_capacity = *puVar20;
      local_328._M_dataplus._M_p = (pointer)*plVar15;
    }
    local_328._M_string_length = plVar15[1];
    *plVar15 = (long)puVar20;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_328._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
  }
  paVar34 = &local_328.field_2;
  local_328._M_string_length = 0;
  local_328.field_2._M_allocated_capacity =
       local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
  uVar25 = local_2e8->coffset;
  local_328._M_dataplus._M_p = (pointer)paVar34;
  if ((uVar25 == 0) || ((local_2e8->base).is_fetch != false)) {
    uVar25 = local_2e8->offset;
    if ((uVar25 != 0) && ((local_2e8->base).is_fetch == false)) {
      if (bVar9 == false) {
        bVar9 = false;
      }
      else {
        bVar9 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,uVar25);
        uVar25 = local_2e8->offset;
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_308,&this->super_CompilerGLSL,uVar25,true);
      goto LAB_0026a9a8;
    }
  }
  else {
    if (bVar9 == false) {
      bVar9 = false;
    }
    else {
      bVar9 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,uVar25);
      uVar25 = local_2e8->coffset;
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_308,&this->super_CompilerGLSL,uVar25,true);
LAB_0026a9a8:
    ::std::__cxx11::string::operator=((string *)&local_328,(string *)&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
  }
  if (local_328._M_string_length != 0) {
    DVar4 = (local_290->image).dim;
    if (DVar4 == Dim3D) {
      if (3 < local_258->vecsize) {
        CompilerGLSL::enclose_expression(&local_2d8,&this->super_CompilerGLSL,&local_328);
        puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_2d8);
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar21) {
          local_308.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_308.field_2._8_8_ = puVar16[3];
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        }
        else {
          local_308.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_308._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_308._M_string_length = puVar16[1];
        *puVar16 = paVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)&local_328,(string *)&local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
      }
      ::std::operator+(&local_308,", ",&local_328);
      ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_308._M_dataplus._M_p);
    }
    else {
      if (DVar4 != Dim2D) goto LAB_0026abbc;
      if (2 < local_258->vecsize) {
        CompilerGLSL::enclose_expression(&local_2d8,&this->super_CompilerGLSL,&local_328);
        puVar16 = (undefined8 *)::std::__cxx11::string::append((char *)&local_2d8);
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar21) {
          local_308.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_308.field_2._8_8_ = puVar16[3];
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        }
        else {
          local_308.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_308._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_308._M_string_length = puVar16[1];
        *puVar16 = paVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)&local_328,(string *)&local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
      }
      ::std::operator+(&local_308,", ",&local_328);
      ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_308._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
  }
LAB_0026abbc:
  if (local_2e8->component != 0) {
    if (((local_290->image).dim == Dim2D) && (local_328._M_string_length == 0)) {
      ::std::__cxx11::string::append((char *)local_2e0);
    }
    if ((byte)((byte)local_204 | (this->msl_options).swizzle_texture_samples ^ 1U) == 1) {
      uVar25 = local_2e8->component;
      if (bVar9 == false) {
        bVar9 = false;
      }
      else {
        bVar9 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,uVar25);
        uVar25 = local_2e8->component;
      }
      to_component_argument_abi_cxx11_(&local_2d8,this,uVar25);
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x2f06f8);
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 == paVar21) {
        local_308.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_308.field_2._8_8_ = puVar16[3];
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      }
      else {
        local_308.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_308._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_308._M_string_length = puVar16[1];
      *puVar16 = paVar21;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_308._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
    }
  }
  if (local_2e8->sample != 0) {
    if (bVar9 == false) {
      bVar9 = false;
    }
    else {
      bVar9 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,local_2e8->sample);
    }
    ::std::__cxx11::string::append((char *)local_2e0);
    CompilerGLSL::to_expression_abi_cxx11_
              (&local_308,&this->super_CompilerGLSL,local_2e8->sample,true);
    ::std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
  }
  *local_1d8 = bVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != paVar34) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  if ((CompilerMSL *)local_2b0._0_8_ != (CompilerMSL *)(local_2b0 + 0x10)) {
    operator_delete((void *)local_2b0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  return local_2e0;
}

Assistant:

string CompilerMSL::to_function_args(const TextureFunctionArguments &args, bool *p_forward)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;
	uint32_t lod = args.lod;
	uint32_t grad_x = args.grad_x;
	uint32_t grad_y = args.grad_y;
	uint32_t bias = args.bias;

	const MSLConstexprSampler *constexpr_sampler = nullptr;
	bool is_dynamic_img_sampler = false;
	if (auto *var = maybe_get_backing_variable(img))
	{
		constexpr_sampler = find_constexpr_sampler(var->basevariable ? var->basevariable : VariableID(var->self));
		is_dynamic_img_sampler = has_extended_decoration(var->self, SPIRVCrossDecorationDynamicImageSampler);
	}

	string farg_str;
	bool forward = true;

	if (!is_dynamic_img_sampler)
	{
		// Texture reference (for some cases)
		if (needs_chroma_reconstruction(constexpr_sampler))
		{
			// Multiplanar images need two or three textures.
			farg_str += to_expression(img);
			for (uint32_t i = 1; i < constexpr_sampler->planes; i++)
				farg_str += join(", ", to_expression(img), plane_name_suffix, i);
		}
		else if ((!constexpr_sampler || !constexpr_sampler->ycbcr_conversion_enable) &&
		         msl_options.swizzle_texture_samples && args.base.is_gather)
		{
			auto *combined = maybe_get<SPIRCombinedImageSampler>(img);
			farg_str += to_expression(combined ? combined->image : img);
		}

		// Sampler reference
		if (!args.base.is_fetch)
		{
			if (!farg_str.empty())
				farg_str += ", ";
			farg_str += to_sampler_expression(img);
		}

		if ((!constexpr_sampler || !constexpr_sampler->ycbcr_conversion_enable) &&
		    msl_options.swizzle_texture_samples && args.base.is_gather)
		{
			// Add the swizzle constant from the swizzle buffer.
			farg_str += ", " + to_swizzle_expression(img);
			used_swizzle_buffer = true;
		}

		// Swizzled gather puts the component before the other args, to allow template
		// deduction to work.
		if (args.component && msl_options.swizzle_texture_samples)
		{
			forward = should_forward(args.component);
			farg_str += ", " + to_component_argument(args.component);
		}
	}

	// Texture coordinates
	forward = forward && should_forward(args.coord);
	auto coord_expr = to_enclosed_expression(args.coord);
	auto &coord_type = expression_type(args.coord);
	bool coord_is_fp = type_is_floating_point(coord_type);
	bool is_cube_fetch = false;

	string tex_coords = coord_expr;
	uint32_t alt_coord_component = 0;

	switch (imgtype.image.dim)
	{

	case Dim1D:
		if (coord_type.vecsize > 1)
			tex_coords = enclose_expression(tex_coords) + ".x";

		if (args.base.is_fetch)
			tex_coords = "uint(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		else if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords = convert_to_f32(tex_coords, 1);

		if (msl_options.texture_1D_as_2D)
		{
			if (args.base.is_fetch)
				tex_coords = "uint2(" + tex_coords + ", 0)";
			else
				tex_coords = "float2(" + tex_coords + ", 0.5)";
		}

		alt_coord_component = 1;
		break;

	case DimBuffer:
		if (coord_type.vecsize > 1)
			tex_coords = enclose_expression(tex_coords) + ".x";

		if (msl_options.texture_buffer_native)
		{
			tex_coords = "uint(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		}
		else
		{
			// Metal texel buffer textures are 2D, so convert 1D coord to 2D.
			// Support for Metal 2.1's new texture_buffer type.
			if (args.base.is_fetch)
			{
				if (msl_options.texel_buffer_texture_width > 0)
				{
					tex_coords = "spvTexelBufferCoord(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
				}
				else
				{
					tex_coords = "spvTexelBufferCoord(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ", " +
					             to_expression(img) + ")";
				}
			}
		}

		alt_coord_component = 1;
		break;

	case DimSubpassData:
		// If we're using Metal's native frame-buffer fetch API for subpass inputs,
		// this path will not be hit.
		tex_coords = "uint2(gl_FragCoord.xy)";
		alt_coord_component = 2;
		break;

	case Dim2D:
		if (coord_type.vecsize > 2)
			tex_coords = enclose_expression(tex_coords) + ".xy";

		if (args.base.is_fetch)
			tex_coords = "uint2(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		else if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords = convert_to_f32(tex_coords, 2);

		alt_coord_component = 2;
		break;

	case Dim3D:
		if (coord_type.vecsize > 3)
			tex_coords = enclose_expression(tex_coords) + ".xyz";

		if (args.base.is_fetch)
			tex_coords = "uint3(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		else if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords = convert_to_f32(tex_coords, 3);

		alt_coord_component = 3;
		break;

	case DimCube:
		if (args.base.is_fetch)
		{
			is_cube_fetch = true;
			tex_coords += ".xy";
			tex_coords = "uint2(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		}
		else
		{
			if (coord_type.vecsize > 3)
				tex_coords = enclose_expression(tex_coords) + ".xyz";
		}

		if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords = convert_to_f32(tex_coords, 3);

		alt_coord_component = 3;
		break;

	default:
		break;
	}

	if (args.base.is_fetch && args.offset)
	{
		// Fetch offsets must be applied directly to the coordinate.
		forward = forward && should_forward(args.offset);
		auto &type = expression_type(args.offset);
		if (type.basetype != SPIRType::UInt)
			tex_coords += " + " + bitcast_expression(SPIRType::UInt, args.offset);
		else
			tex_coords += " + " + to_enclosed_expression(args.offset);
	}
	else if (args.base.is_fetch && args.coffset)
	{
		// Fetch offsets must be applied directly to the coordinate.
		forward = forward && should_forward(args.coffset);
		auto &type = expression_type(args.coffset);
		if (type.basetype != SPIRType::UInt)
			tex_coords += " + " + bitcast_expression(SPIRType::UInt, args.coffset);
		else
			tex_coords += " + " + to_enclosed_expression(args.coffset);
	}

	// If projection, use alt coord as divisor
	if (args.base.is_proj)
	{
		if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords += " / " + convert_to_f32(to_extract_component_expression(args.coord, alt_coord_component), 1);
		else
			tex_coords += " / " + to_extract_component_expression(args.coord, alt_coord_component);
	}

	if (!farg_str.empty())
		farg_str += ", ";

	if (imgtype.image.dim == DimCube && imgtype.image.arrayed && msl_options.emulate_cube_array)
	{
		farg_str += "spvCubemapTo2DArrayFace(" + tex_coords + ").xy";

		if (is_cube_fetch)
			farg_str += ", uint(" + to_extract_component_expression(args.coord, 2) + ")";
		else
			farg_str +=
			    ", uint(spvCubemapTo2DArrayFace(" + tex_coords + ").z) + (uint(" +
			    round_fp_tex_coords(to_extract_component_expression(args.coord, alt_coord_component), coord_is_fp) +
			    ") * 6u)";

		add_spv_func_and_recompile(SPVFuncImplCubemapTo2DArrayFace);
	}
	else
	{
		farg_str += tex_coords;

		// If fetch from cube, add face explicitly
		if (is_cube_fetch)
		{
			// Special case for cube arrays, face and layer are packed in one dimension.
			if (imgtype.image.arrayed)
				farg_str += ", uint(" + to_extract_component_expression(args.coord, 2) + ") % 6u";
			else
				farg_str +=
				    ", uint(" + round_fp_tex_coords(to_extract_component_expression(args.coord, 2), coord_is_fp) + ")";
		}

		// If array, use alt coord
		if (imgtype.image.arrayed)
		{
			// Special case for cube arrays, face and layer are packed in one dimension.
			if (imgtype.image.dim == DimCube && args.base.is_fetch)
			{
				farg_str += ", uint(" + to_extract_component_expression(args.coord, 2) + ") / 6u";
			}
			else
			{
				farg_str +=
				    ", uint(" +
				    round_fp_tex_coords(to_extract_component_expression(args.coord, alt_coord_component), coord_is_fp) +
				    ")";
				if (imgtype.image.dim == DimSubpassData)
				{
					if (msl_options.multiview)
						farg_str += " + gl_ViewIndex";
					else if (msl_options.arrayed_subpass_input)
						farg_str += " + gl_Layer";
				}
			}
		}
		else if (imgtype.image.dim == DimSubpassData)
		{
			if (msl_options.multiview)
				farg_str += ", gl_ViewIndex";
			else if (msl_options.arrayed_subpass_input)
				farg_str += ", gl_Layer";
		}
	}

	// Depth compare reference value
	if (args.dref)
	{
		forward = forward && should_forward(args.dref);
		farg_str += ", ";

		auto &dref_type = expression_type(args.dref);

		string dref_expr;
		if (args.base.is_proj)
			dref_expr = join(to_enclosed_expression(args.dref), " / ",
			                 to_extract_component_expression(args.coord, alt_coord_component));
		else
			dref_expr = to_expression(args.dref);

		if (sampling_type_needs_f32_conversion(dref_type))
			dref_expr = convert_to_f32(dref_expr, 1);

		farg_str += dref_expr;

		if (msl_options.is_macos() && (grad_x || grad_y))
		{
			// For sample compare, MSL does not support gradient2d for all targets (only iOS apparently according to docs).
			// However, the most common case here is to have a constant gradient of 0, as that is the only way to express
			// LOD == 0 in GLSL with sampler2DArrayShadow (cascaded shadow mapping).
			// We will detect a compile-time constant 0 value for gradient and promote that to level(0) on MSL.
			bool constant_zero_x = !grad_x || expression_is_constant_null(grad_x);
			bool constant_zero_y = !grad_y || expression_is_constant_null(grad_y);
			if (constant_zero_x && constant_zero_y)
			{
				lod = 0;
				grad_x = 0;
				grad_y = 0;
				farg_str += ", level(0)";
			}
			else
			{
				SPIRV_CROSS_THROW("Using non-constant 0.0 gradient() qualifier for sample_compare. This is not "
				                  "supported in MSL macOS.");
			}
		}

		if (msl_options.is_macos() && bias)
		{
			// Bias is not supported either on macOS with sample_compare.
			// Verify it is compile-time zero, and drop the argument.
			if (expression_is_constant_null(bias))
			{
				bias = 0;
			}
			else
			{
				SPIRV_CROSS_THROW(
				    "Using non-constant 0.0 bias() qualifier for sample_compare. This is not supported in MSL macOS.");
			}
		}
	}

	// LOD Options
	// Metal does not support LOD for 1D textures.
	if (bias && (imgtype.image.dim != Dim1D || msl_options.texture_1D_as_2D))
	{
		forward = forward && should_forward(bias);
		farg_str += ", bias(" + to_expression(bias) + ")";
	}

	// Metal does not support LOD for 1D textures.
	if (lod && (imgtype.image.dim != Dim1D || msl_options.texture_1D_as_2D))
	{
		forward = forward && should_forward(lod);
		if (args.base.is_fetch)
		{
			farg_str += ", " + to_expression(lod);
		}
		else
		{
			farg_str += ", level(" + to_expression(lod) + ")";
		}
	}
	else if (args.base.is_fetch && !lod && (imgtype.image.dim != Dim1D || msl_options.texture_1D_as_2D) &&
	         imgtype.image.dim != DimBuffer && !imgtype.image.ms && imgtype.image.sampled != 2)
	{
		// Lod argument is optional in OpImageFetch, but we require a LOD value, pick 0 as the default.
		// Check for sampled type as well, because is_fetch is also used for OpImageRead in MSL.
		farg_str += ", 0";
	}

	// Metal does not support LOD for 1D textures.
	if ((grad_x || grad_y) && (imgtype.image.dim != Dim1D || msl_options.texture_1D_as_2D))
	{
		forward = forward && should_forward(grad_x);
		forward = forward && should_forward(grad_y);
		string grad_opt;
		switch (imgtype.image.dim)
		{
		case Dim2D:
			grad_opt = "2d";
			break;
		case Dim3D:
			grad_opt = "3d";
			break;
		case DimCube:
			if (imgtype.image.arrayed && msl_options.emulate_cube_array)
				grad_opt = "2d";
			else
				grad_opt = "cube";
			break;
		default:
			grad_opt = "unsupported_gradient_dimension";
			break;
		}
		farg_str += ", gradient" + grad_opt + "(" + to_expression(grad_x) + ", " + to_expression(grad_y) + ")";
	}

	if (args.min_lod)
	{
		if (msl_options.is_macos())
		{
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("min_lod_clamp() is only supported in MSL 2.2+ and up on macOS.");
		}
		else if (msl_options.is_ios())
			SPIRV_CROSS_THROW("min_lod_clamp() is not supported on iOS.");

		forward = forward && should_forward(args.min_lod);
		farg_str += ", min_lod_clamp(" + to_expression(args.min_lod) + ")";
	}

	// Add offsets
	string offset_expr;
	if (args.coffset && !args.base.is_fetch)
	{
		forward = forward && should_forward(args.coffset);
		offset_expr = to_expression(args.coffset);
	}
	else if (args.offset && !args.base.is_fetch)
	{
		forward = forward && should_forward(args.offset);
		offset_expr = to_expression(args.offset);
	}

	if (!offset_expr.empty())
	{
		switch (imgtype.image.dim)
		{
		case Dim2D:
			if (coord_type.vecsize > 2)
				offset_expr = enclose_expression(offset_expr) + ".xy";

			farg_str += ", " + offset_expr;
			break;

		case Dim3D:
			if (coord_type.vecsize > 3)
				offset_expr = enclose_expression(offset_expr) + ".xyz";

			farg_str += ", " + offset_expr;
			break;

		default:
			break;
		}
	}

	if (args.component)
	{
		// If 2D has gather component, ensure it also has an offset arg
		if (imgtype.image.dim == Dim2D && offset_expr.empty())
			farg_str += ", int2(0)";

		if (!msl_options.swizzle_texture_samples || is_dynamic_img_sampler)
		{
			forward = forward && should_forward(args.component);
			farg_str += ", " + to_component_argument(args.component);
		}
	}

	if (args.sample)
	{
		forward = forward && should_forward(args.sample);
		farg_str += ", ";
		farg_str += to_expression(args.sample);
	}

	*p_forward = forward;

	return farg_str;
}